

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

void ws_dec_info(ws_decoder *dec,Curl_easy *data,char *msg)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  char *msg_local;
  Curl_easy *data_local;
  ws_decoder *dec_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (dec->head_len != 0) {
    if (dec->head_len == 1) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_write.log_level)) {
        pcVar1 = ws_frame_name_of_op(dec->head[0]);
        pcVar2 = " NON-FINAL";
        if ((dec->head[0] & 0x80) != 0) {
          pcVar2 = "";
        }
        Curl_trc_write(data,"websocket, decoded %s [%s%s]",msg,pcVar1,pcVar2);
      }
    }
    else if (dec->head_len < dec->head_total) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_write.log_level)) {
        pcVar1 = ws_frame_name_of_op(dec->head[0]);
        pcVar2 = " NON-FINAL";
        if ((dec->head[0] & 0x80) != 0) {
          pcVar2 = "";
        }
        Curl_trc_write(data,"websocket, decoded %s [%s%s](%d/%d)",msg,pcVar1,pcVar2,
                       (ulong)(uint)dec->head_len,CONCAT44(uVar3,dec->head_total));
      }
    }
    else if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) && (0 < Curl_trc_feat_write.log_level))
    {
      pcVar1 = ws_frame_name_of_op(dec->head[0]);
      pcVar2 = " NON-FINAL";
      if ((dec->head[0] & 0x80) != 0) {
        pcVar2 = "";
      }
      Curl_trc_write(data,"websocket, decoded %s [%s%s payload=%ld/%ld]",msg,pcVar1,pcVar2,
                     dec->payload_offset,dec->payload_len);
    }
  }
  return;
}

Assistant:

static void ws_dec_info(struct ws_decoder *dec, struct Curl_easy *data,
                        const char *msg)
{
  switch(dec->head_len) {
  case 0:
    break;
  case 1:
    CURL_TRC_WRITE(data, "websocket, decoded %s [%s%s]", msg,
                   ws_frame_name_of_op(dec->head[0]),
                   (dec->head[0] & WSBIT_FIN) ? "" : " NON-FINAL");
    break;
  default:
    if(dec->head_len < dec->head_total) {
      CURL_TRC_WRITE(data, "websocket, decoded %s [%s%s](%d/%d)", msg,
                     ws_frame_name_of_op(dec->head[0]),
                     (dec->head[0] & WSBIT_FIN) ? "" : " NON-FINAL",
                     dec->head_len, dec->head_total);
    }
    else {
      CURL_TRC_WRITE(data, "websocket, decoded %s [%s%s payload=%"
                     FMT_OFF_T "/%" FMT_OFF_T "]",
                     msg, ws_frame_name_of_op(dec->head[0]),
                     (dec->head[0] & WSBIT_FIN) ? "" : " NON-FINAL",
                     dec->payload_offset, dec->payload_len);
    }
    break;
  }
}